

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three-colour-triplets-recognizer.cpp
# Opt level: O2

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::ThreeColourTripletsRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,ThreeColourTripletsRecognizer *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  initializer_list<mahjong::Pattern> __l;
  allocator_type local_e;
  less<mahjong::Pattern> local_d;
  Pattern local_c;
  
  lVar3 = 0x18;
  do {
    if (lVar3 == 0x3c) {
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      return __return_storage_ptr__;
    }
    lVar2 = lVar3 + -0x18;
    lVar3 = lVar3 + 4;
  } while (*(int *)((long)(this->front_tile_count_of_triplets_or_quads)._M_elems + lVar2) != 3);
  local_c = ThreeColourTriplets;
  __l._M_len = 1;
  __l._M_array = &local_c;
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
            (__return_storage_ptr__,__l,&local_d,&local_e);
  return __return_storage_ptr__;
}

Assistant:

std::set<Pattern> ThreeColourTripletsRecognizer::recognize()
{
	for (auto it : front_tile_count_of_triplets_or_quads)
	{
		if (it == 3)
		{
			return { Pattern::ThreeColourTriplets };
		}
	}

	return {};
}